

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)15,(moira::Mode)12,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  char in_CL;
  int *in_RDX;
  StrWriter *in_RSI;
  long in_RDI;
  u32 dst;
  StrWriter *in_stack_ffffffffffffffb8;
  UInt u;
  UInt local_2c;
  int local_28;
  u32 local_20;
  
  local_20 = (int)in_CL + *in_RDX + 2;
  this_00 = StrWriter::operator<<(in_RSI);
  local_28 = *(int *)(in_RDI + 0x14);
  StrWriter::operator<<(this_00,(Align)local_28);
  u.raw = (u32)((ulong)in_RDI >> 0x20);
  UInt::UInt(&local_2c,local_20);
  StrWriter::operator<<(in_stack_ffffffffffffffb8,u);
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op)
{
    if (MIMIC_MUSASHI && S == Byte && (u8)op == 0xFF) {
        dasmIllegal(str, addr, op);
        return;
    }

    u32 dst = addr + 2;
    dst += (S == Byte) ? (i8)op : (i16)dasmRead<S>(addr);

    str << Ins<I>{} << tab << UInt(dst);
}